

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall V2Transport::ProcessReceivedPacketBytes(V2Transport *this)

{
  char cVar1;
  long lVar2;
  Span<const_std::byte> input;
  string_view source_file;
  string_view source_file_00;
  bool bVar3;
  uint32_t uVar4;
  size_type sVar5;
  char *in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar6;
  Span<std::byte> SVar7;
  Level in_stack_00000070;
  uint *in_stack_00000080;
  long *in_stack_00000088;
  bool ret;
  bool ignore;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffec8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v;
  char *in_stack_fffffffffffffed0;
  BIP324Cipher *in_stack_fffffffffffffed8;
  int line;
  RecvState recv_state;
  V2Transport *in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  undefined8 in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  BIP324Cipher *in_stack_ffffffffffffff18;
  LogFlags in_stack_ffffffffffffff30;
  int iVar8;
  undefined1 in_stack_ffffffffffffff38 [16];
  Span<const_std::byte> in_stack_ffffffffffffff68;
  ConstevalFormatString<2U> fmt;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  char *in_stack_ffffffffffffff88;
  string_view in_stack_ffffffffffffff90;
  byte *in_stack_ffffffffffffffa0;
  uchar *local_50;
  
  iVar8 = in_stack_ffffffffffffff38._4_4_;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  fmt.fmt = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(AnnotatedMixin<std::mutex> *)0x20a7f0)
  ;
  inline_assertion_check<false,bool>
            ((bool *)CONCAT17(in_stack_fffffffffffffeef,
                              CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
             (char *)in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (in_stack_fffffffffffffec8);
  if (sVar5 == 3) {
    MakeByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed8);
    input.m_size._0_7_ = in_stack_ffffffffffffff10;
    input.m_data = (byte *)in_stack_ffffffffffffff08;
    input.m_size._7_1_ = in_stack_ffffffffffffff17;
    uVar4 = BIP324Cipher::DecryptLength(in_stack_fffffffffffffed8,input);
    *(uint32_t *)(in_RDI + 0x4c8) = uVar4;
    if (0x3d090d < *(uint *)(in_RDI + 0x4c8)) {
      bVar3 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffffec8,Trace);
      if (bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffeef,
                            CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
                   (char *)in_stack_fffffffffffffee0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffeef,
                            CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
                   (char *)in_stack_fffffffffffffee0);
        source_file._M_len._6_1_ = in_stack_ffffffffffffff86;
        source_file._M_len._0_6_ = in_stack_ffffffffffffff80;
        source_file._M_len._7_1_ = in_stack_ffffffffffffff87;
        source_file._M_str = in_stack_ffffffffffffff88;
        LogPrintFormatInternal<unsigned_int,long>
                  (in_stack_ffffffffffffff90,source_file,iVar8,in_stack_ffffffffffffff30,
                   in_stack_00000070,fmt,in_stack_00000080,in_stack_00000088);
      }
      bVar3 = false;
      goto LAB_0020acdd;
    }
  }
  else {
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (in_stack_fffffffffffffec8);
    if ((3 < sVar5) &&
       (sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (in_stack_fffffffffffffec8), sVar5 == *(int *)(in_RDI + 0x4c8) + 0x14)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffeef,
                          CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
                 (size_type)in_stack_fffffffffffffee0);
      MakeByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed8)
      ;
      Span<const_std::byte>::subspan
                ((Span<const_std::byte> *)in_stack_fffffffffffffed8,
                 (size_t)in_stack_fffffffffffffed0);
      SVar6 = MakeByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffed8);
      iVar8 = SVar6.m_data._4_4_;
      SVar7 = MakeWritableByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffed8);
      line = (int)((ulong)in_stack_fffffffffffffed8 >> 0x38);
      v = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)SVar7.m_data;
      local_50 = (uchar *)SVar7.m_size;
      SVar6.m_size._0_6_ = in_stack_ffffffffffffff80;
      SVar6.m_data = (byte *)fmt.fmt;
      SVar6.m_size._6_1_ = in_stack_ffffffffffffff86;
      SVar6.m_size._7_1_ = in_stack_ffffffffffffff87;
      SVar7.m_size = (size_t)v;
      SVar7.m_data = in_stack_ffffffffffffffa0;
      bVar3 = BIP324Cipher::Decrypt
                        (in_stack_ffffffffffffff18,SVar6,in_stack_ffffffffffffff68,
                         (bool *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),SVar7
                        );
      if (!bVar3) {
        bVar3 = ::LogAcceptCategory((LogFlags)v,Trace);
        if (bVar3) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffeef,
                              CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
                     (char *)in_stack_fffffffffffffee0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffeef,
                              CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
                     (char *)in_stack_fffffffffffffee0);
          source_file_00._M_len._6_1_ = in_stack_ffffffffffffff86;
          source_file_00._M_len._0_6_ = in_stack_ffffffffffffff80;
          source_file_00._M_len._7_1_ = in_stack_ffffffffffffff87;
          source_file_00._M_str = in_stack_ffffffffffffff88;
          LogPrintFormatInternal<unsigned_int,long>
                    (in_stack_ffffffffffffff90,source_file_00,iVar8,0x10d4b32,in_stack_00000070,fmt,
                     in_stack_00000080,in_stack_00000088);
        }
        bVar3 = false;
        goto LAB_0020acdd;
      }
      ClearShrink<std::vector<unsigned_char,std::allocator<unsigned_char>>>(v);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(v);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(v);
      ReadLE32(local_50);
      RandAddEvent((uint32_t)((ulong)v >> 0x20));
      cVar1 = in_RDI[0x518];
      recv_state = (RecvState)((uint)line >> 0x18);
      if (cVar1 == '\x03') {
        SetReceiveState(in_stack_fffffffffffffee0,recv_state);
      }
      else if (cVar1 == '\x04') {
        SetReceiveState(in_stack_fffffffffffffee0,recv_state);
      }
      else {
        inline_assertion_check<false,bool>
                  ((bool *)CONCAT17(cVar1,CONCAT16(in_stack_fffffffffffffeee,
                                                   in_stack_fffffffffffffee8)),
                   (char *)in_stack_fffffffffffffee0,line,(char *)local_50,(char *)v);
      }
      ClearShrink<std::vector<unsigned_char,std::allocator<unsigned_char>>>(v);
      if (in_RDI[0x518] != '\x05') {
        ClearShrink<std::vector<unsigned_char,std::allocator<unsigned_char>>>(v);
      }
    }
  }
  bVar3 = true;
LAB_0020acdd:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool V2Transport::ProcessReceivedPacketBytes() noexcept
{
    AssertLockHeld(m_recv_mutex);
    Assume(m_recv_state == RecvState::VERSION || m_recv_state == RecvState::APP);

    // The maximum permitted contents length for a packet, consisting of:
    // - 0x00 byte: indicating long message type encoding
    // - 12 bytes of message type
    // - payload
    static constexpr size_t MAX_CONTENTS_LEN =
        1 + CMessageHeader::COMMAND_SIZE +
        std::min<size_t>(MAX_SIZE, MAX_PROTOCOL_MESSAGE_LENGTH);

    if (m_recv_buffer.size() == BIP324Cipher::LENGTH_LEN) {
        // Length descriptor received.
        m_recv_len = m_cipher.DecryptLength(MakeByteSpan(m_recv_buffer));
        if (m_recv_len > MAX_CONTENTS_LEN) {
            LogDebug(BCLog::NET, "V2 transport error: packet too large (%u bytes), peer=%d\n", m_recv_len, m_nodeid);
            return false;
        }
    } else if (m_recv_buffer.size() > BIP324Cipher::LENGTH_LEN && m_recv_buffer.size() == m_recv_len + BIP324Cipher::EXPANSION) {
        // Ciphertext received, decrypt it into m_recv_decode_buffer.
        // Note that it is impossible to reach this branch without hitting the branch above first,
        // as GetMaxBytesToProcess only allows up to LENGTH_LEN into the buffer before that point.
        m_recv_decode_buffer.resize(m_recv_len);
        bool ignore{false};
        bool ret = m_cipher.Decrypt(
            /*input=*/MakeByteSpan(m_recv_buffer).subspan(BIP324Cipher::LENGTH_LEN),
            /*aad=*/MakeByteSpan(m_recv_aad),
            /*ignore=*/ignore,
            /*contents=*/MakeWritableByteSpan(m_recv_decode_buffer));
        if (!ret) {
            LogDebug(BCLog::NET, "V2 transport error: packet decryption failure (%u bytes), peer=%d\n", m_recv_len, m_nodeid);
            return false;
        }
        // We have decrypted a valid packet with the AAD we expected, so clear the expected AAD.
        ClearShrink(m_recv_aad);
        // Feed the last 4 bytes of the Poly1305 authentication tag (and its timing) into our RNG.
        RandAddEvent(ReadLE32(m_recv_buffer.data() + m_recv_buffer.size() - 4));

        // At this point we have a valid packet decrypted into m_recv_decode_buffer. If it's not a
        // decoy, which we simply ignore, use the current state to decide what to do with it.
        if (!ignore) {
            switch (m_recv_state) {
            case RecvState::VERSION:
                // Version message received; transition to application phase. The contents is
                // ignored, but can be used for future extensions.
                SetReceiveState(RecvState::APP);
                break;
            case RecvState::APP:
                // Application message decrypted correctly. It can be extracted using GetMessage().
                SetReceiveState(RecvState::APP_READY);
                break;
            default:
                // Any other state is invalid (this function should not have been called).
                Assume(false);
            }
        }
        // Wipe the receive buffer where the next packet will be received into.
        ClearShrink(m_recv_buffer);
        // In all but APP_READY state, we can wipe the decoded contents.
        if (m_recv_state != RecvState::APP_READY) ClearShrink(m_recv_decode_buffer);
    } else {
        // We either have less than 3 bytes, so we don't know the packet's length yet, or more
        // than 3 bytes but less than the packet's full ciphertext. Wait until those arrive.
    }
    return true;
}